

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O0

void __thiscall uint256_tests::basics::test_method(basics *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  bool bVar1;
  uint256 *puVar2;
  uint160 *puVar3;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe5e8;
  undefined1 *in_stack_ffffffffffffe5f0;
  char *in_stack_ffffffffffffe5f8;
  char *in_stack_ffffffffffffe600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe608;
  const_string *in_stack_ffffffffffffe610;
  const_string *msg;
  size_t in_stack_ffffffffffffe618;
  undefined1 *line_num;
  const_string *in_stack_ffffffffffffe620;
  char *file;
  unit_test_log_t *in_stack_ffffffffffffe628;
  unit_test_log_t *this_00;
  undefined8 in_stack_ffffffffffffe640;
  uchar *in_stack_ffffffffffffe648;
  basics *this_local;
  undefined1 local_1288 [16];
  undefined1 local_1278 [32];
  undefined1 local_1258 [16];
  const_string local_1248;
  undefined1 local_1238 [16];
  undefined1 local_1228 [64];
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [80];
  undefined1 local_1188 [16];
  undefined1 local_1178 [64];
  undefined1 local_1138 [16];
  undefined1 local_1128 [64];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [64];
  undefined1 local_1098 [16];
  undefined1 local_1088 [64];
  undefined1 local_1048 [16];
  undefined1 local_1038 [56];
  undefined8 local_1000;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [64];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [64];
  undefined1 local_f58 [16];
  undefined1 local_f48 [64];
  undefined1 local_f08 [16];
  undefined1 local_ef8 [80];
  undefined1 local_ea8 [16];
  undefined1 local_e98 [64];
  undefined1 local_e58 [16];
  undefined1 local_e48 [64];
  undefined1 local_e08 [16];
  undefined1 local_df8 [64];
  undefined1 local_db8 [16];
  undefined1 local_da8 [64];
  undefined1 local_d68 [16];
  undefined1 local_d58 [64];
  undefined1 local_d18 [16];
  undefined1 local_d08 [64];
  undefined1 local_cc8 [16];
  undefined1 local_cb8 [64];
  undefined1 local_c78 [16];
  undefined1 local_c68 [64];
  undefined1 local_c28 [16];
  undefined1 local_c18 [64];
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [64];
  undefined1 local_b88 [16];
  undefined1 local_b78 [64];
  undefined1 local_b38 [16];
  undefined1 local_b28 [64];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [64];
  undefined1 local_a98 [16];
  undefined1 local_a88 [64];
  undefined1 local_a48 [16];
  undefined1 local_a38 [64];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [64];
  undefined1 local_9a8 [16];
  undefined1 local_998 [64];
  undefined1 local_958 [16];
  undefined1 local_948 [64];
  undefined1 local_908 [16];
  undefined1 local_8f8 [64];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [64];
  undefined1 local_868 [16];
  undefined1 local_858 [64];
  undefined1 local_818 [16];
  undefined1 local_808 [64];
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [64];
  undefined1 local_778 [16];
  undefined1 local_768 [64];
  undefined1 local_728 [16];
  undefined1 local_718 [64];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [64];
  undefined4 local_688 [8];
  undefined4 local_668 [8];
  undefined4 local_648;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  undefined4 local_638;
  undefined4 local_4f8 [8];
  undefined4 local_4d8 [8];
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  lazy_ostream local_308 [2];
  undefined1 local_2e8 [32];
  lazy_ostream local_2c8 [2];
  undefined1 local_2a8 [32];
  lazy_ostream local_288 [2];
  undefined1 local_268 [32];
  lazy_ostream local_248 [2];
  undefined1 local_228 [32];
  lazy_ostream local_208 [2];
  undefined1 local_1e8 [32];
  lazy_ostream local_1c8 [2];
  undefined1 local_1a8 [32];
  lazy_ostream local_188 [2];
  undefined1 local_168 [32];
  lazy_ostream local_148 [2];
  undefined1 local_128 [32];
  lazy_ostream local_108 [2];
  undefined1 local_e8 [32];
  lazy_ostream local_c8 [2];
  undefined1 local_a8 [32];
  lazy_ostream local_88 [2];
  undefined1 local_68 [32];
  lazy_ostream local_48 [2];
  undefined1 local_28 [32];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(R1Array,32)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_48;
    in_stack_ffffffffffffe5e8 = "R1L.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_6c8,local_6d8,0x42,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(R1Array,20)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_88;
    in_stack_ffffffffffffe5e8 = "R1S.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_718,local_728,0x43,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(R2Array,32)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_c8;
    in_stack_ffffffffffffe5e8 = "R2L.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_768,local_778,0x44,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(R2Array,20)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_108;
    in_stack_ffffffffffffe5e8 = "R2S.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_7b8,local_7c8,0x45,1,2,local_e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(ZeroArray,32)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_148;
    in_stack_ffffffffffffe5e8 = "ZeroL.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_808,local_818,0x46,1,2,local_128);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(ZeroArray,20)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_188;
    in_stack_ffffffffffffe5e8 = "ZeroS.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_858,local_868,0x47,1,2,local_168);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(OneArray,32)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_1c8;
    in_stack_ffffffffffffe5e8 = "OneL.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_8a8,local_8b8,0x48,1,2,local_1a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(OneArray,20)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_208;
    in_stack_ffffffffffffe5e8 = "OneS.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_8f8,local_908,0x49,1,2,local_1e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(MaxArray,32)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_248;
    in_stack_ffffffffffffe5e8 = "MaxL.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_948,local_958,0x4a,1,2,local_228);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(MaxArray,20)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_288;
    in_stack_ffffffffffffe5e8 = "MaxS.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_998,local_9a8,0x4b,1,2,local_268);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(ZeroArray,32)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_2c8;
    in_stack_ffffffffffffe5e8 = "OneL.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,std::__cxx11::string,std::__cxx11::string>
              (local_9e8,local_9f8,0x4c,1,3,local_2a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    ArrayToString_abi_cxx11_
              (in_stack_ffffffffffffe648,(uint)((ulong)in_stack_ffffffffffffe640 >> 0x20));
    in_stack_ffffffffffffe5f8 = "ArrayToString(ZeroArray,20)";
    in_stack_ffffffffffffe5f0 = (undefined1 *)local_308;
    in_stack_ffffffffffffe5e8 = "OneS.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,std::__cxx11::string,std::__cxx11::string>
              (local_a38,local_a48,0x4d,1,3,local_2e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    in_stack_ffffffffffffe5f8 = "R2L";
    in_stack_ffffffffffffe5f0 = R2L;
    in_stack_ffffffffffffe5e8 = "R1L";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
              (local_a88,local_a98,0x50,1,3,&R1L);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    in_stack_ffffffffffffe5f8 = "R2S";
    in_stack_ffffffffffffe5f0 = R2S;
    in_stack_ffffffffffffe5e8 = "R1S";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
              (local_ad8,local_ae8,0x50,1,3,&R1S);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    in_stack_ffffffffffffe5f8 = "OneL";
    in_stack_ffffffffffffe5f0 = OneL;
    in_stack_ffffffffffffe5e8 = "ZeroL";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
              (local_b28,local_b38,0x51,1,3,ZeroL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    in_stack_ffffffffffffe5f8 = "OneS";
    in_stack_ffffffffffffe5f0 = OneS;
    in_stack_ffffffffffffe5e8 = "ZeroS";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
              (local_b78,local_b88,0x51,1,3,ZeroS);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    in_stack_ffffffffffffe5f8 = "ZeroL";
    in_stack_ffffffffffffe5f0 = ZeroL;
    in_stack_ffffffffffffe5e8 = "OneL";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
              (local_bc8,local_bd8,0x52,1,3,OneL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    in_stack_ffffffffffffe5f8 = "ZeroS";
    in_stack_ffffffffffffe5f0 = ZeroS;
    in_stack_ffffffffffffe5e8 = "OneS";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
              (local_c18,local_c28,0x52,1,3,OneS);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    in_stack_ffffffffffffe5f8 = "ZeroL";
    in_stack_ffffffffffffe5f0 = ZeroL;
    in_stack_ffffffffffffe5e8 = "MaxL";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
              (local_c68,local_c78,0x53,1,3,MaxL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    in_stack_ffffffffffffe5f8 = "ZeroS";
    in_stack_ffffffffffffe5f0 = ZeroS;
    in_stack_ffffffffffffe5e8 = "MaxS";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
              (local_cb8,local_cc8,0x53,1,3,MaxS);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe608);
    str._M_str = (char *)in_stack_ffffffffffffe608;
    str._M_len = (size_t)in_stack_ffffffffffffe600;
    uint256::FromHex(str);
    puVar2 = std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "R1L";
    in_stack_ffffffffffffe5f0 = (undefined1 *)&R1L;
    in_stack_ffffffffffffe5e8 = "uint256::FromHex(R1L.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_d08,local_d18,0x56,1,2,puVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe608);
    str_00._M_str = (char *)in_stack_ffffffffffffe608;
    str_00._M_len = (size_t)in_stack_ffffffffffffe600;
    uint256::FromHex(str_00);
    puVar2 = std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "R2L";
    in_stack_ffffffffffffe5f0 = R2L;
    in_stack_ffffffffffffe5e8 = "uint256::FromHex(R2L.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_d58,local_d68,0x57,1,2,puVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe608);
    str_01._M_str = (char *)in_stack_ffffffffffffe608;
    str_01._M_len = (size_t)in_stack_ffffffffffffe600;
    uint256::FromHex(str_01);
    puVar2 = std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "ZeroL";
    in_stack_ffffffffffffe5f0 = ZeroL;
    in_stack_ffffffffffffe5e8 = "uint256::FromHex(ZeroL.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_da8,local_db8,0x58,1,2,puVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe608);
    str_02._M_str = (char *)in_stack_ffffffffffffe608;
    str_02._M_len = (size_t)in_stack_ffffffffffffe600;
    uint256::FromHex(str_02);
    puVar2 = std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "OneL";
    in_stack_ffffffffffffe5f0 = OneL;
    in_stack_ffffffffffffe5e8 = "uint256::FromHex(OneL.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_df8,local_e08,0x59,1,2,puVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe608);
    str_03._M_str = (char *)in_stack_ffffffffffffe608;
    str_03._M_len = (size_t)in_stack_ffffffffffffe600;
    uint256::FromHex(str_03);
    puVar2 = std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "MaxL";
    in_stack_ffffffffffffe5f0 = MaxL;
    in_stack_ffffffffffffe5e8 = "uint256::FromHex(MaxL.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_e48,local_e58,0x5a,1,2,puVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe608,
               in_stack_ffffffffffffe600);
    str_04._M_str = (char *)in_stack_ffffffffffffe608;
    str_04._M_len = (size_t)in_stack_ffffffffffffe600;
    uint256::FromHex(str_04);
    puVar2 = std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "R1L";
    in_stack_ffffffffffffe5f0 = (undefined1 *)&R1L;
    in_stack_ffffffffffffe5e8 = "uint256::FromHex(R1ArrayHex).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_e98,local_ea8,0x5b,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    local_4a8 = DAT_023d60f9;
    uStack_4a0 = DAT_023d6101;
    local_4b8 = (undefined4)R1L;
    uStack_4b4 = R1L._4_4_;
    uStack_4b0 = (undefined4)DAT_023d60f1;
    uStack_4ac = DAT_023d60f1._4_4_;
    in_stack_ffffffffffffe5f8 = "R1L";
    in_stack_ffffffffffffe5f0 = (undefined1 *)&R1L;
    in_stack_ffffffffffffe5e8 = "uint256(R1L)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_ef8,local_f08,0x5c,1,2,&local_4b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    local_4d8[4] = ZeroL._16_4_;
    local_4d8[5] = ZeroL._20_4_;
    local_4d8[6] = ZeroL._24_4_;
    local_4d8[7] = ZeroL._28_4_;
    local_4d8[0] = ZeroL._0_4_;
    local_4d8[1] = ZeroL._4_4_;
    local_4d8[2] = ZeroL._8_4_;
    local_4d8[3] = ZeroL._12_4_;
    in_stack_ffffffffffffe5f8 = "ZeroL";
    in_stack_ffffffffffffe5f0 = ZeroL;
    in_stack_ffffffffffffe5e8 = "uint256(ZeroL)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_f48,local_f58,0x5d,1,2,local_4d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    local_4f8[4] = OneL._16_4_;
    local_4f8[5] = OneL._20_4_;
    local_4f8[6] = OneL._24_4_;
    local_4f8[7] = OneL._28_4_;
    local_4f8[0] = OneL._0_4_;
    local_4f8[1] = OneL._4_4_;
    local_4f8[2] = OneL._8_4_;
    local_4f8[3] = OneL._12_4_;
    in_stack_ffffffffffffe5f8 = "OneL";
    in_stack_ffffffffffffe5f0 = OneL;
    in_stack_ffffffffffffe5e8 = "uint256(OneL)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_f98,local_fa8,0x5e,1,2,local_4f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe608);
    str_05._M_str = (char *)in_stack_ffffffffffffe608;
    str_05._M_len = (size_t)in_stack_ffffffffffffe600;
    uint160::FromHex(str_05);
    puVar3 = std::optional<uint160>::value((optional<uint160> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "R1S";
    in_stack_ffffffffffffe5f0 = (undefined1 *)&R1S;
    in_stack_ffffffffffffe5e8 = "uint160::FromHex(R1S.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_fe8,local_ff8,0x60,1,2,puVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe608);
    str_06._M_str = (char *)in_stack_ffffffffffffe608;
    str_06._M_len = (size_t)in_stack_ffffffffffffe600;
    uint160::FromHex(str_06);
    puVar3 = std::optional<uint160>::value((optional<uint160> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "R2S";
    in_stack_ffffffffffffe5f0 = R2S;
    in_stack_ffffffffffffe5e8 = "uint160::FromHex(R2S.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1038,local_1048,0x61,1,2,puVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe608);
    str_07._M_str = (char *)in_stack_ffffffffffffe608;
    str_07._M_len = (size_t)in_stack_ffffffffffffe600;
    uint160::FromHex(str_07);
    puVar3 = std::optional<uint160>::value((optional<uint160> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "ZeroS";
    in_stack_ffffffffffffe5f0 = ZeroS;
    in_stack_ffffffffffffe5e8 = "uint160::FromHex(ZeroS.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1088,local_1098,0x62,1,2,puVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe608);
    str_08._M_str = (char *)in_stack_ffffffffffffe608;
    str_08._M_len = (size_t)in_stack_ffffffffffffe600;
    uint160::FromHex(str_08);
    puVar3 = std::optional<uint160>::value((optional<uint160> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "OneS";
    in_stack_ffffffffffffe5f0 = OneS;
    in_stack_ffffffffffffe5e8 = "uint160::FromHex(OneS.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_10d8,local_10e8,99,1,2,puVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe608);
    str_09._M_str = (char *)in_stack_ffffffffffffe608;
    str_09._M_len = (size_t)in_stack_ffffffffffffe600;
    uint160::FromHex(str_09);
    puVar3 = std::optional<uint160>::value((optional<uint160> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "MaxS";
    in_stack_ffffffffffffe5f0 = MaxS;
    in_stack_ffffffffffffe5e8 = "uint160::FromHex(MaxS.ToString()).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1128,local_1138,100,1,2,puVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe5f8,
               in_stack_ffffffffffffe5f0,(size_type)in_stack_ffffffffffffe5e8);
    str_10._M_str = (char *)in_stack_ffffffffffffe608;
    str_10._M_len = (size_t)in_stack_ffffffffffffe600;
    uint160::FromHex(str_10);
    puVar3 = std::optional<uint160>::value((optional<uint160> *)in_stack_ffffffffffffe5f8);
    in_stack_ffffffffffffe5f8 = "R1S";
    in_stack_ffffffffffffe5f0 = (undefined1 *)&R1S;
    in_stack_ffffffffffffe5e8 = "uint160::FromHex(std::string_view{R1ArrayHex + 24, 40}).value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1178,local_1188,0x65,1,2,puVar3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    local_638 = DAT_023d6119;
    local_648 = (undefined4)R1S;
    uStack_644 = R1S._4_4_;
    uStack_640 = (undefined4)DAT_023d6111;
    uStack_63c = DAT_023d6111._4_4_;
    in_stack_ffffffffffffe5f8 = "R1S";
    in_stack_ffffffffffffe5f0 = (undefined1 *)&R1S;
    in_stack_ffffffffffffe5e8 = "uint160(R1S)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_11d8,local_11e8,0x67,1,2,&local_648);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,in_stack_ffffffffffffe618,
               in_stack_ffffffffffffe610);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    local_668[4] = ZeroS._16_4_;
    local_668[0] = ZeroS._0_4_;
    local_668[1] = ZeroS._4_4_;
    local_668[2] = ZeroS._8_4_;
    local_668[3] = ZeroS._12_4_;
    in_stack_ffffffffffffe5f8 = "ZeroS";
    in_stack_ffffffffffffe5f0 = ZeroS;
    in_stack_ffffffffffffe5e8 = "uint160(ZeroS)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1228,local_1238,0x68,1,2,local_668);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    msg = &local_1248;
    this_00 = (unit_test_log_t *)0x66;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    line_num = local_1258;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe5f0,(char (*) [1])in_stack_ffffffffffffe5e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0,
               (unsigned_long)in_stack_ffffffffffffe5e8);
    local_688[4] = OneS._16_4_;
    local_688[0] = OneS._0_4_;
    local_688[1] = OneS._4_4_;
    local_688[2] = OneS._8_4_;
    local_688[3] = OneS._12_4_;
    in_stack_ffffffffffffe5f8 = "OneS";
    in_stack_ffffffffffffe5f0 = OneS;
    in_stack_ffffffffffffe5e8 = "uint160(OneS)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
              (local_1278,local_1288,0x69,1,2,local_688);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe5e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( basics ) // constructors, equality, inequality
{
    // constructor uint256(vector<char>):
    BOOST_CHECK_EQUAL(R1L.ToString(), ArrayToString(R1Array,32));
    BOOST_CHECK_EQUAL(R1S.ToString(), ArrayToString(R1Array,20));
    BOOST_CHECK_EQUAL(R2L.ToString(), ArrayToString(R2Array,32));
    BOOST_CHECK_EQUAL(R2S.ToString(), ArrayToString(R2Array,20));
    BOOST_CHECK_EQUAL(ZeroL.ToString(), ArrayToString(ZeroArray,32));
    BOOST_CHECK_EQUAL(ZeroS.ToString(), ArrayToString(ZeroArray,20));
    BOOST_CHECK_EQUAL(OneL.ToString(), ArrayToString(OneArray,32));
    BOOST_CHECK_EQUAL(OneS.ToString(), ArrayToString(OneArray,20));
    BOOST_CHECK_EQUAL(MaxL.ToString(), ArrayToString(MaxArray,32));
    BOOST_CHECK_EQUAL(MaxS.ToString(), ArrayToString(MaxArray,20));
    BOOST_CHECK_NE(OneL.ToString(), ArrayToString(ZeroArray,32));
    BOOST_CHECK_NE(OneS.ToString(), ArrayToString(ZeroArray,20));

    // == and !=
    BOOST_CHECK_NE(R1L, R2L); BOOST_CHECK_NE(R1S, R2S);
    BOOST_CHECK_NE(ZeroL, OneL); BOOST_CHECK_NE(ZeroS, OneS);
    BOOST_CHECK_NE(OneL, ZeroL); BOOST_CHECK_NE(OneS, ZeroS);
    BOOST_CHECK_NE(MaxL, ZeroL); BOOST_CHECK_NE(MaxS, ZeroS);

    // String Constructor and Copy Constructor
    BOOST_CHECK_EQUAL(uint256::FromHex(R1L.ToString()).value(), R1L);
    BOOST_CHECK_EQUAL(uint256::FromHex(R2L.ToString()).value(), R2L);
    BOOST_CHECK_EQUAL(uint256::FromHex(ZeroL.ToString()).value(), ZeroL);
    BOOST_CHECK_EQUAL(uint256::FromHex(OneL.ToString()).value(), OneL);
    BOOST_CHECK_EQUAL(uint256::FromHex(MaxL.ToString()).value(), MaxL);
    BOOST_CHECK_EQUAL(uint256::FromHex(R1ArrayHex).value(), R1L);
    BOOST_CHECK_EQUAL(uint256(R1L), R1L);
    BOOST_CHECK_EQUAL(uint256(ZeroL), ZeroL);
    BOOST_CHECK_EQUAL(uint256(OneL), OneL);

    BOOST_CHECK_EQUAL(uint160::FromHex(R1S.ToString()).value(), R1S);
    BOOST_CHECK_EQUAL(uint160::FromHex(R2S.ToString()).value(), R2S);
    BOOST_CHECK_EQUAL(uint160::FromHex(ZeroS.ToString()).value(), ZeroS);
    BOOST_CHECK_EQUAL(uint160::FromHex(OneS.ToString()).value(), OneS);
    BOOST_CHECK_EQUAL(uint160::FromHex(MaxS.ToString()).value(), MaxS);
    BOOST_CHECK_EQUAL(uint160::FromHex(std::string_view{R1ArrayHex + 24, 40}).value(), R1S);

    BOOST_CHECK_EQUAL(uint160(R1S), R1S);
    BOOST_CHECK_EQUAL(uint160(ZeroS), ZeroS);
    BOOST_CHECK_EQUAL(uint160(OneS), OneS);
}